

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tradedbook.cpp
# Opt level: O3

void __thiscall hedg::Traded_Book::Traded_Book(Traded_Book *this)

{
  Bid *pBVar1;
  int i;
  long lVar2;
  atomic<hedg::Bid> aVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  
  lVar2 = 0;
  do {
    pBVar1 = &this->book[lVar2]._M_i;
    pBVar1->price = 0.0;
    pBVar1->size = 0.0;
    pBVar1[1].price = 0.0;
    pBVar1[1].size = 0.0;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x15e);
  this->ticks[4] = 0.2;
  this->ticks[5] = 0.5;
  this->ticks[6] = 1.0;
  this->ticks[7] = 2.0;
  this->ticks[0] = 0.01;
  this->ticks[1] = 0.02;
  this->ticks[2] = 0.05;
  this->ticks[3] = 0.1;
  this->ticks[8] = 5.0;
  this->ticks[9] = 10.0;
  this->indexes[0] = 1;
  this->indexes[1] = 100;
  this->indexes[2] = 0x96;
  this->indexes[3] = 0xaa;
  this->indexes[4] = 0xbe;
  this->indexes[5] = 0xd2;
  this->indexes[6] = 0xe6;
  this->indexes[7] = 0xf0;
  this->indexes[8] = 0xfa;
  this->indexes[9] = 0x104;
  LOCK();
  (this->max_price)._M_i = 1.1754944e-38;
  UNLOCK();
  LOCK();
  (this->min_price)._M_i = 3.4028235e+38;
  UNLOCK();
  LOCK();
  (this->max_size)._M_i = 1.1754944e-38;
  UNLOCK();
  LOCK();
  (this->min_size)._M_i = 3.4028235e+38;
  UNLOCK();
  LOCK();
  (this->min_price_idx).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->max_price_idx).super___atomic_base<int>._M_i = -1;
  UNLOCK();
  LOCK();
  (this->max_traded_price_idx).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->min_traded_price_idx).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  lVar2 = 0;
  fVar6 = 1.01;
  uVar4 = 0;
  do {
    if ((((((fVar6 < 1.0) || (uVar5 = 0, 2.0 <= fVar6)) &&
          ((fVar6 < 2.0 || (uVar5 = 1, 3.0 <= fVar6)))) &&
         ((fVar6 < 3.0 || (uVar5 = 2, 4.0 <= fVar6)))) &&
        ((fVar6 < 4.0 || (uVar5 = 3, 6.0 <= fVar6)))) &&
       (((((fVar6 < 6.0 || (uVar5 = 4, 10.0 <= fVar6)) &&
          ((fVar6 < 10.0 || (uVar5 = 5, 20.0 <= fVar6)))) &&
         ((fVar6 < 20.0 || (uVar5 = 6, 30.0 <= fVar6)))) &&
        (((fVar6 < 30.0 || (uVar5 = 7, 50.0 <= fVar6)) &&
         ((fVar6 < 50.0 || (uVar5 = 8, 100.0 <= fVar6)))))))) {
      uVar5 = (ulong)uVar4;
      if (fVar6 < 1000.0) {
        uVar5 = 9;
      }
      if (fVar6 < 100.0) {
        uVar5 = (ulong)uVar4;
      }
    }
    fVar6 = (float)(int)(fVar6 * 100.0 + 0.5) / 100.0;
    aVar3._M_i.size = 0.0;
    aVar3._M_i.price = fVar6;
    LOCK();
    this->book[lVar2]._M_i = aVar3._M_i;
    UNLOCK();
    uVar4 = (uint)uVar5;
    fVar6 = fVar6 + this->ticks[uVar5];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x15e);
  return;
}

Assistant:

Traded_Book::Traded_Book() {

	max_price.store(std::numeric_limits<float>::min());
	min_price.store(std::numeric_limits<float>::max());
	max_size.store(std::numeric_limits<float>::min());
	min_size.store(std::numeric_limits<float>::max());
	min_price_idx.store(0);
	max_price_idx.store(-1);
	max_traded_price_idx.store(0);
	min_traded_price_idx.store(0);

	float x = 1.01;
	int space = 0;
	for (int i = 0, t_idx = 0; i < 350; ++i) {

		if (1 <= x && x < 2)
			t_idx = 0;
		else if (2 <= x && x < 3)
			t_idx = 1;
		else if (3 <= x && x < 4)
			t_idx = 2;
		else if (4 <= x && x < 6)
			t_idx = 3;
		else if (6 <= x && x < 10)
			t_idx = 4;
		else if (10 <= x && x < 20)
			t_idx = 5;
		else if (20 <= x && x < 30)
			t_idx = 6;
		else if (30 <= x && x < 50)
			t_idx = 7;
		else if (50 <= x && x < 100)
			t_idx = 8;
		else if (100 <= x && x < 1000)
			t_idx = 9;

		x = round_2dp(x);
		book[i].store(Bid(x, 0));
		x += ticks[t_idx];
	}
}